

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynForEachIterator * ParseForEachIterator(ParseContext *ctx,bool isFirst)

{
  Lexeme *begin;
  int iVar1;
  int iVar2;
  SynBase *type;
  undefined4 extraout_var;
  Lexeme *pLVar3;
  Lexeme *end;
  SynBase *value;
  undefined4 extraout_var_00;
  SynForEachIterator *this;
  InplaceStr name;
  undefined4 extraout_var_01;
  
  begin = ctx->currentLexeme;
  type = ParseType(ctx,(bool *)0x0,false);
  if (ctx->currentLexeme->type != lex_string) {
    ctx->currentLexeme = begin;
    type = (SynBase *)0x0;
    if (begin->type != lex_string) {
      return (SynForEachIterator *)0x0;
    }
  }
  name = ParseContext::Consume(ctx);
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
  pLVar3 = ParseContext::Previous(ctx);
  end = ParseContext::Previous(ctx);
  SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var,iVar1),pLVar3,end,name);
  if ((isFirst) && (ctx->currentLexeme->type != lex_in)) {
    ctx->currentLexeme = begin;
    this = (SynForEachIterator *)0x0;
  }
  else {
    anon_unknown.dwarf_147a9::CheckConsume(ctx,lex_in,"ERROR: \'in\' expected after variable name");
    value = ParseTernaryExpr(ctx);
    if (value == (SynBase *)0x0) {
      anon_unknown.dwarf_147a9::Report
                (ctx,ctx->currentLexeme,"ERROR: expression expected after \'in\'");
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      value = (SynBase *)CONCAT44(extraout_var_00,iVar2);
      SynError::SynError((SynError *)value,ctx->currentLexeme,ctx->currentLexeme);
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
    this = (SynForEachIterator *)CONCAT44(extraout_var_01,iVar2);
    pLVar3 = ParseContext::Previous(ctx);
    SynForEachIterator::SynForEachIterator
              (this,begin,pLVar3,type,(SynIdentifier *)CONCAT44(extraout_var,iVar1),value);
  }
  return this;
}

Assistant:

SynForEachIterator* ParseForEachIterator(ParseContext &ctx, bool isFirst)
{
	Lexeme *start = ctx.currentLexeme;

	// Optional type
	SynBase *type = ParseType(ctx);

	// Must be followed by a type
	if(!ctx.At(lex_string))
	{
		// Backtrack
		ctx.currentLexeme = start;

		type = NULL;
	}

	if(ctx.At(lex_string))
	{
		InplaceStr name = ctx.Consume();
		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);

		if(isFirst && !ctx.At(lex_in))
		{
			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		CheckConsume(ctx, lex_in, "ERROR: 'in' expected after variable name");

		SynBase *value = ParseTernaryExpr(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: expression expected after 'in'");

			value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		return new (ctx.get<SynForEachIterator>()) SynForEachIterator(start, ctx.Previous(), type, nameIdentifier, value);
	}

	return NULL;
}